

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O1

int fB(sunrealtype t,N_Vector c,N_Vector cB,N_Vector cBdot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  sunrealtype (*acoef) [6];
  
  lVar9 = N_VGetArrayPointer();
  lVar10 = N_VGetArrayPointer(cB);
  lVar11 = N_VGetArrayPointer(cBdot);
  uVar6 = *(uint *)((long)user_data + 0x40);
  lVar18 = (long)user_data + 0x328;
  lVar23 = (long)user_data + 0x4e28;
  uVar7 = *(uint *)((long)user_data + 0x44);
  dVar3 = *(double *)((long)user_data + 0x310);
  dVar4 = *(double *)((long)user_data + 0x318);
  uVar28 = (ulong)uVar6;
  lVar1 = (long)(int)uVar7 * 8;
  lVar2 = (long)(int)uVar6 * 8;
  lVar21 = 0;
  lVar27 = 0;
  lVar26 = lVar10;
  lVar35 = lVar9;
  do {
    uVar30 = uVar7;
    if (lVar27 == 0x13) {
      uVar30 = -uVar7;
    }
    uVar32 = -uVar7;
    if (lVar27 == 0) {
      uVar32 = uVar7;
    }
    uVar33 = (ulong)(uVar32 + (int)lVar21);
    uVar31 = (ulong)(uVar30 + (int)lVar21);
    lVar24 = 0;
    lVar17 = lVar18;
    lVar20 = lVar21;
    lVar22 = lVar23;
    lVar25 = lVar26;
    lVar34 = lVar35;
    do {
      if (0 < (int)uVar6) {
        lVar12 = lVar24 * (int)uVar6 + lVar27 * (int)uVar7;
        lVar16 = lVar9 + lVar12 * 8;
        uVar13 = 0;
        do {
          *(double *)(lVar17 + uVar13 * 8) =
               *(double *)((long)user_data + uVar13 * 8 + 0x250) *
               ((double)(int)lVar24 * dVar3 * (double)(int)lVar27 * dVar4 + 1.0);
          uVar13 = uVar13 + 1;
        } while (uVar28 != uVar13);
        if (0 < (int)uVar6) {
          uVar13 = 0;
          pdVar15 = (double *)((long)user_data + 0x130);
          do {
            uVar29 = 0;
            pdVar14 = pdVar15;
            do {
              *(double *)(lVar17 + uVar29 * 8) =
                   *pdVar14 * *(double *)(lVar16 + uVar13 * 8) + *(double *)(lVar17 + uVar29 * 8);
              uVar29 = uVar29 + 1;
              pdVar14 = pdVar14 + 6;
            } while (uVar28 != uVar29);
            uVar13 = uVar13 + 1;
            pdVar15 = pdVar15 + 1;
          } while (uVar13 != uVar28);
          if (0 < (int)uVar6) {
            uVar13 = 0;
            do {
              dVar5 = *(double *)(lVar17 + uVar13 * 8);
              *(double *)(lVar17 + 0x4b00 + uVar13 * 8) = *(double *)(lVar25 + uVar13 * 8) * dVar5;
              *(double *)(lVar17 + uVar13 * 8) = dVar5 * *(double *)(lVar34 + uVar13 * 8);
              uVar13 = uVar13 + 1;
            } while (uVar28 != uVar13);
            if (0 < (int)uVar6) {
              uVar13 = 0;
              pdVar15 = (double *)((long)user_data + 0x130);
              do {
                uVar29 = 0;
                do {
                  *(double *)(lVar22 + uVar29 * 8) =
                       pdVar15[uVar29] * *(double *)(lVar16 + uVar13 * 8) *
                       *(double *)(lVar10 + lVar12 * 8 + uVar13 * 8) +
                       *(double *)(lVar22 + uVar29 * 8);
                  uVar29 = uVar29 + 1;
                } while (uVar28 != uVar29);
                uVar13 = uVar13 + 1;
                pdVar15 = pdVar15 + 6;
              } while (uVar13 != uVar28);
            }
          }
        }
      }
      uVar30 = uVar6;
      if (lVar24 == 0x13) {
        uVar30 = -uVar6;
      }
      uVar32 = -uVar6;
      if (lVar24 == 0) {
        uVar32 = uVar6;
      }
      if (0 < (int)uVar6) {
        iVar19 = (int)lVar20;
        lVar16 = 0;
        do {
          iVar8 = (int)lVar16;
          lVar12 = (long)(iVar8 + iVar19);
          dVar5 = *(double *)(lVar10 + lVar12 * 8);
          *(double *)(lVar11 + lVar12 * 8) =
               (-*(double *)((long)user_data + lVar16 * 8 + 0x2e0) *
                ((*(double *)(lVar10 + (long)((int)uVar31 + iVar8) * 8) - dVar5) -
                (dVar5 - *(double *)(lVar10 + (long)((int)uVar33 + iVar8) * 8))) -
               ((*(double *)(lVar10 + (long)(int)(uVar30 + iVar19 + iVar8) * 8) - dVar5) -
               (dVar5 - *(double *)(lVar10 + (long)(int)(uVar32 + iVar19 + iVar8) * 8))) *
               *(double *)((long)user_data + lVar16 * 8 + 0x2b0)) -
               *(double *)((long)user_data + lVar12 * 8 + 0x4e28);
          lVar16 = lVar16 + 1;
        } while ((ulong)(uVar6 + 1) - 1 != lVar16);
      }
      lVar24 = lVar24 + 1;
      lVar17 = lVar17 + lVar2;
      lVar34 = lVar34 + lVar2;
      lVar25 = lVar25 + lVar2;
      lVar22 = lVar22 + lVar2;
      lVar20 = lVar20 + uVar28;
      uVar33 = uVar33 + uVar28;
      uVar31 = uVar31 + uVar28;
    } while (lVar24 != 0x14);
    lVar27 = lVar27 + 1;
    lVar18 = lVar18 + lVar1;
    lVar35 = lVar35 + lVar1;
    lVar26 = lVar26 + lVar1;
    lVar23 = lVar23 + lVar1;
    lVar21 = lVar21 + (ulong)uVar7;
  } while (lVar27 != 0x14);
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector c, N_Vector cB, N_Vector cBdot,
              void* user_data)
{
  int i, ic, ici, idxl, idxu, idyl, idyu, iyoff, jx, jy, ns, mxns;
  sunrealtype dcxli, dcxui, dcyli, dcyui, x, y, *cox, *coy, *fsave, *fBsave, dx,
    dy;
  sunrealtype *cdata, *cBdata, *cBdotdata;
  WebData wdata;

  wdata     = (WebData)user_data;
  cdata     = N_VGetArrayPointer(c);
  cBdata    = N_VGetArrayPointer(cB);
  cBdotdata = N_VGetArrayPointer(cBdot);

  mxns   = wdata->mxns;
  ns     = wdata->ns;
  fsave  = wdata->fsave;
  fBsave = wdata->fBsave;
  cox    = wdata->cox;
  coy    = wdata->coy;
  mxns   = wdata->mxns;
  dx     = wdata->dx;
  dy     = wdata->dy;

  for (jy = 0; jy < MY; jy++)
  {
    y     = jy * dy;
    iyoff = mxns * jy;
    idyu  = (jy == MY - 1) ? -mxns : mxns;
    idyl  = (jy == 0) ? -mxns : mxns;
    for (jx = 0; jx < MX; jx++)
    {
      x  = jx * dx;
      ic = iyoff + ns * jx;
      /* Get interaction rates at one point (x,y). */
      WebRatesB(x, y, t, cdata + ic, cBdata + ic, fsave + ic, fBsave + ic, wdata);
      idxu = (jx == MX - 1) ? -ns : ns;
      idxl = (jx == 0) ? -ns : ns;
      for (i = 1; i <= ns; i++)
      {
        ici = ic + i - 1;
        /* Do differencing in y. */
        dcyli = cBdata[ici] - cBdata[ici - idyl];
        dcyui = cBdata[ici + idyu] - cBdata[ici];
        /* Do differencing in x. */
        dcxli = cBdata[ici] - cBdata[ici - idxl];
        dcxui = cBdata[ici + idxu] - cBdata[ici];
        /* Collect terms and load cdot elements. */
        cBdotdata[ici] = -coy[i - 1] * (dcyui - dcyli) -
                         cox[i - 1] * (dcxui - dcxli) - fBsave[ici];
      }
    }
  }

  return (0);
}